

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O3

uint __thiscall EIF::GetKey(EIF *this,int keynum)

{
  pointer pEVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pEVar1 = (this->data).super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->data).
                super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)pEVar1;
  if (lVar2 != 0) {
    uVar4 = (lVar2 >> 4) * 0x6db6db6db6db6db7;
    uVar3 = 0;
    do {
      uVar5 = uVar3 & 0xffffffff;
      if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
        uVar5 = 0;
      }
      if ((pEVar1[uVar5].type == Key) && (pEVar1[uVar5].field_25.scrollmap == keynum))
      goto LAB_001354ec;
      uVar3 = uVar3 + 1;
    } while (uVar4 + (uVar4 == 0) != uVar3);
  }
  uVar3 = 0;
LAB_001354ec:
  return (uint)uVar3;
}

Assistant:

unsigned int EIF::GetKey(int keynum) const
{
	for (std::size_t i = 0; i < this->data.size(); ++i)
	{
		if (this->Get(i).type == EIF::Key && this->Get(i).key == keynum)
			return i;
	}

	return 0;
}